

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset_props.cpp
# Opt level: O2

UBool uset_resemblesPattern_63(UChar *pattern,int32_t patternLength,int32_t pos)

{
  UBool UVar1;
  char16_t cVar2;
  bool bVar3;
  UnicodeString pat;
  UnicodeString UStack_58;
  
  icu_63::UnicodeString::UnicodeString(&UStack_58,pattern,patternLength);
  if (-1 < UStack_58.fUnion.fStackFields.fLengthAndFlags) {
    UStack_58.fUnion.fFields.fLength = (int)UStack_58.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if (pos + 1 < UStack_58.fUnion.fFields.fLength) {
    cVar2 = icu_63::UnicodeString::doCharAt(&UStack_58,pos);
    bVar3 = true;
    if (cVar2 == L'[') goto LAB_002be97c;
  }
  UVar1 = icu_63::UnicodeSet::resemblesPattern(&UStack_58,pos);
  bVar3 = UVar1 != '\0';
LAB_002be97c:
  icu_63::UnicodeString::~UnicodeString(&UStack_58);
  return bVar3;
}

Assistant:

U_CAPI UBool U_EXPORT2
uset_resemblesPattern(const UChar *pattern, int32_t patternLength,
                      int32_t pos) {

    UnicodeString pat(pattern, patternLength);

    return ((pos+1) < pat.length() &&
            pat.charAt(pos) == (UChar)91/*[*/) ||
            UnicodeSet::resemblesPattern(pat, pos);
}